

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall pbrt::ParsedScene::ObjectInstance(ParsedScene *this,string *name,FileLoc loc)

{
  FileLoc loc_00;
  FileLoc loc_01;
  bool bVar1;
  long in_RDI;
  undefined1 auVar2 [64];
  value_type *in_stack_00000008;
  vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_> *in_stack_00000010;
  Transform *renderFromInstance;
  AnimatedTransform animatedRenderFromInstance;
  Transform worldFromRender;
  FileLoc *in_stack_ffffffffffffeec8;
  SceneRepresentation *in_stack_ffffffffffffeed0;
  Transform *in_stack_ffffffffffffeee0;
  char (*in_stack_ffffffffffffef00) [15];
  undefined1 auVar3 [16];
  undefined1 in_stack_ffffffffffffef08 [64];
  undefined4 in_stack_ffffffffffffef58;
  int in_stack_ffffffffffffef5c;
  ParsedScene *in_stack_ffffffffffffef60;
  AnimatedTransform *in_stack_ffffffffffffef90;
  Transform *in_stack_ffffffffffffef98;
  Transform *renderFromInstance_00;
  AnimatedTransform *in_stack_ffffffffffffefa0;
  AnimatedTransform *renderFromInstanceAnim;
  undefined4 in_stack_ffffffffffffefa8;
  undefined4 in_stack_ffffffffffffefac;
  undefined4 uVar4;
  InstanceSceneEntity *in_stack_ffffffffffffefb0;
  InstanceSceneEntity *this_00;
  size_t in_stack_ffffffffffffefc0;
  undefined1 *puVar5;
  char *in_stack_ffffffffffffefc8;
  undefined8 in_stack_ffffffffffffefd0;
  Float in_stack_fffffffffffff434;
  Transform *in_stack_fffffffffffff438;
  Float in_stack_fffffffffffff444;
  Transform *in_stack_fffffffffffff448;
  AnimatedTransform *in_stack_fffffffffffff450;
  undefined1 local_8a8 [992];
  undefined1 local_4c8 [384];
  undefined1 local_348 [696];
  Transform local_90;
  
  auVar3 = in_stack_ffffffffffffef08._24_16_;
  if (*(int *)(in_RDI + 0x860) == 2) {
    Error<char_const(&)[15]>
              (in_stack_ffffffffffffef08._8_8_,in_stack_ffffffffffffef08._0_8_,
               in_stack_ffffffffffffef00);
  }
  else if (*(int *)(in_RDI + 0x860) == 0) {
    Error<char_const(&)[15]>
              (in_stack_ffffffffffffef08._8_8_,in_stack_ffffffffffffef08._0_8_,
               in_stack_ffffffffffffef00);
  }
  else if (*(long *)(in_RDI + 0xb28) == 0) {
    Inverse(in_stack_ffffffffffffeee0);
    bVar1 = CTMIsAnimated((ParsedScene *)0x43d171);
    if (bVar1) {
      GetCTM(in_stack_ffffffffffffef60,in_stack_ffffffffffffef5c);
      renderFromInstanceAnim = (AnimatedTransform *)(local_4c8 + 0x100);
      renderFromInstance_00 = &local_90;
      pbrt::Transform::operator*
                ((Transform *)in_stack_ffffffffffffef60,
                 (Transform *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
      uVar4 = *(undefined4 *)(in_RDI + 0xa38);
      GetCTM(in_stack_ffffffffffffef60,in_stack_ffffffffffffef5c);
      this_00 = (InstanceSceneEntity *)local_4c8;
      pbrt::Transform::operator*
                ((Transform *)in_stack_ffffffffffffef60,
                 (Transform *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
      puVar5 = local_348;
      AnimatedTransform::AnimatedTransform
                (in_stack_fffffffffffff450,in_stack_fffffffffffff448,in_stack_fffffffffffff444,
                 in_stack_fffffffffffff438,in_stack_fffffffffffff434);
      loc_00.filename._M_str = (char *)(in_RDI + 0x818);
      loc_00.filename._M_len = (size_t)puVar5;
      loc_00._16_8_ = local_8a8;
      InstanceSceneEntity::InstanceSceneEntity
                (this_00,(string *)CONCAT44(uVar4,in_stack_ffffffffffffefa8),loc_00,
                 renderFromInstanceAnim,renderFromInstance_00);
      std::vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>::push_back
                (in_stack_00000010,in_stack_00000008);
      InstanceSceneEntity::~InstanceSceneEntity((InstanceSceneEntity *)0x43d309);
    }
    else {
      GetCTM(in_stack_ffffffffffffef60,in_stack_ffffffffffffef5c);
      pbrt::Transform::operator*
                ((Transform *)in_stack_ffffffffffffef60,
                 (Transform *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
      TransformCache::Lookup(auVar3._8_8_,auVar3._0_8_);
      auVar2 = ZEXT1664((undefined1  [16])0x0);
      vmovdqu64_avx512f(auVar2);
      vmovdqu64_avx512f(auVar2);
      vmovdqu64_avx512f(auVar2);
      vmovdqu64_avx512f(auVar2);
      vmovdqu64_avx512f(auVar2);
      vmovdqu64_avx512f(auVar2);
      vmovdqu64_avx512f(auVar2);
      vmovdqu64_avx512f(auVar2);
      vmovdqu64_avx512f(auVar2);
      vmovdqu64_avx512f(auVar2);
      vmovdqu64_avx512f(auVar2);
      AnimatedTransform::AnimatedTransform(in_stack_ffffffffffffef90);
      loc_01.filename._M_str = in_stack_ffffffffffffefc8;
      loc_01.filename._M_len = in_stack_ffffffffffffefc0;
      loc_01.line = (int)in_stack_ffffffffffffefd0;
      loc_01.column = (int)((ulong)in_stack_ffffffffffffefd0 >> 0x20);
      InstanceSceneEntity::InstanceSceneEntity
                (in_stack_ffffffffffffefb0,
                 (string *)CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8),loc_01,
                 in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
      std::vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>::push_back
                (in_stack_00000010,in_stack_00000008);
      InstanceSceneEntity::~InstanceSceneEntity((InstanceSceneEntity *)0x43d4e9);
    }
  }
  else {
    SceneRepresentation::ErrorExitDeferred<>
              (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,(char *)0x43d143);
  }
  return;
}

Assistant:

void ParsedScene::ObjectInstance(const std::string &name, FileLoc loc) {
    VERIFY_WORLD("ObjectInstance");

    if (currentInstance != nullptr) {
        ErrorExitDeferred(&loc,
                          "ObjectInstance can't be called inside instance definition");
        return;
    }

    class Transform worldFromRender = Inverse(renderFromWorld);

    if (CTMIsAnimated()) {
        AnimatedTransform animatedRenderFromInstance(
            GetCTM(0) * worldFromRender, transformStartTime, GetCTM(1) * worldFromRender,
            transformEndTime);

        instances.push_back(
            InstanceSceneEntity(name, loc, animatedRenderFromInstance, nullptr));
    } else {
        const class Transform *renderFromInstance =
            transformCache.Lookup(GetCTM(0) * worldFromRender);

        instances.push_back(
            InstanceSceneEntity(name, loc, AnimatedTransform(), renderFromInstance));
    }
}